

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O0

void __thiscall
OpenMD::InversePowerSeries::calcForce(InversePowerSeries *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  reference this_00;
  size_type sVar5;
  reference pvVar6;
  double *pdVar7;
  int *in_RSI;
  long in_RDI;
  __type_conflict _Var8;
  __type_conflict _Var9;
  Vector<double,_3U> *pVVar10;
  RealType dudr;
  RealType pot_temp;
  uint i;
  RealType fnc;
  RealType fn;
  RealType ric;
  RealType ri;
  RealType myDerivC;
  RealType myDeriv;
  RealType myPotC;
  RealType myPot;
  vector<double,_std::allocator<double>_> coefficients;
  vector<int,_std::allocator<int>_> powers;
  InversePowerSeriesInteractionData *mixer;
  Vector<double,_3U> *in_stack_fffffffffffffe98;
  Vector<double,_3U> *in_stack_fffffffffffffea0;
  Vector<double,_3U> *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  uint local_9c;
  double local_78;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> local_48;
  vector<int,_std::allocator<int>_> local_30;
  reference local_18;
  int *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize((InversePowerSeries *)
               coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)*local_10);
  this_00 = std::
            vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                          *)(in_RDI + 0x58),(long)*pvVar4);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_10[1]);
  local_18 = std::
             vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
             ::operator[](this_00,(long)*pvVar4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_60 = 0.0;
  local_68 = 0.0;
  local_78 = 0.0;
  dVar1 = *(double *)(local_10 + 0xc);
  for (local_9c = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_30),
      local_9c < sVar5; local_9c = local_9c + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(ulong)local_9c);
    dVar2 = *pvVar6;
    std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)local_9c);
    _Var8 = std::pow<double,int>
                      ((double)in_stack_fffffffffffffea0,
                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(ulong)local_9c);
    dVar3 = *pvVar6;
    std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)local_9c);
    _Var9 = std::pow<double,int>
                      ((double)in_stack_fffffffffffffea0,
                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    local_60 = dVar2 * _Var8 + local_60;
    local_68 = dVar3 * _Var9 + local_68;
    std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)local_9c);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)local_9c);
    local_78 = -((double)*pvVar4 * dVar3 * _Var9) * (1.0 / dVar1) + local_78;
  }
  if ((*(byte *)(local_10 + 0xe) & 1) == 0) {
    if ((*(byte *)((long)local_10 + 0x39) & 1) == 0) {
      local_68 = 0.0;
    }
    else {
      local_68 = local_78 * (*(double *)(local_10 + 8) - *(double *)(local_10 + 0xc)) + local_68;
    }
  }
  pVVar10 = (Vector<double,_3U> *)(*(double *)(local_10 + 0x14) * (local_60 - local_68));
  *(double *)(local_10 + 0x34) = *(double *)(local_10 + 0x34) + (double)pVVar10;
  this_01 = *(vector<double,_std::allocator<double>_> **)(local_10 + 0x10);
  pdVar7 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x18),1);
  *pdVar7 = (double)this_01 * (double)pVVar10 + *pdVar7;
  if ((*(byte *)((long)local_10 + 0xdb) & 1) != 0) {
    in_stack_fffffffffffffe98 = *(Vector<double,_3U> **)(local_10 + 0x10);
    in_stack_fffffffffffffea8 =
         (Vector<double,_3U> *)
         Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x38),1);
    in_stack_fffffffffffffea8->data_[0] =
         (double)in_stack_fffffffffffffe98 * (double)pVVar10 + in_stack_fffffffffffffea8->data_[0];
    in_stack_fffffffffffffea0 = pVVar10;
  }
  OpenMD::operator*(in_stack_fffffffffffffea8,(double)in_stack_fffffffffffffea0);
  operator/(in_stack_fffffffffffffea8,(double)in_stack_fffffffffffffea0);
  Vector<double,_3U>::operator+=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  return;
}

Assistant:

void InversePowerSeries::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    InversePowerSeriesInteractionData& mixer =
        MixingMap[InversePowerSeriesTids[idat.atid1]]
                 [InversePowerSeriesTids[idat.atid2]];
    std::vector<int> powers            = mixer.powers;
    std::vector<RealType> coefficients = mixer.coefficients;

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType ri  = 1.0 / idat.rij;
    RealType ric = 1.0 / idat.rcut;

    RealType fn, fnc;

    for (unsigned int i = 0; i < powers.size(); i++) {
      fn  = coefficients[i] * pow(ri, powers[i]);
      fnc = coefficients[i] * pow(ric, powers[i]);
      myPot += fn;
      myPotC += fnc;
      myDeriv -= powers[i] * fn * ri;
      myDerivC -= powers[i] * fnc * ric;
    }

    if (idat.shiftedPot) {
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut);
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * (myDeriv - myDerivC);

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }